

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O2

uint64_t __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_key_prefix_splits
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  uint64_t uVar1;
  
  std::mutex::lock(&this->mutex);
  uVar1 = (this->db_).key_prefix_splits;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return uVar1;
}

Assistant:

[[nodiscard]] auto get_key_prefix_splits() const {
    const std::lock_guard guard{mutex};
    return db_.get_key_prefix_splits();
  }